

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearSegmentParameter.cpp
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::LinearSegmentParameter::Decode(LinearSegmentParameter *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  if (0x37 < KVar1) {
    KDataStream::Read(stream,&this->m_ui8SegNum);
    KDataStream::Read(stream,&(this->m_ModificationUnion).m_ui8Modifications);
    (*(this->m_ObjApr).super_ObjectAppearance.super_DataTypeBase._vptr_DataTypeBase[3])
              (&this->m_ObjApr,stream);
    (*(this->m_Loc).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Loc,stream);
    (*(this->m_Ori).super_DataTypeBase._vptr_DataTypeBase[3])(&this->m_Ori,stream);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Length);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Width);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Height);
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Depth);
    KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void LinearSegmentParameter::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < LINEAR_SEGMENT_PARAMETER_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    stream >> m_ui8SegNum
           >> m_ModificationUnion.m_ui8Modifications
           >> KDIS_STREAM m_ObjApr
           >> KDIS_STREAM m_Loc
           >> KDIS_STREAM m_Ori
           >> m_ui16Length
           >> m_ui16Width
           >> m_ui16Height
           >> m_ui16Depth
           >> m_ui32Padding;
}